

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O0

void draw_4_circles(Am_Drawonable *d)

{
  Am_Style *arg7;
  Am_Style local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [24];
  Am_Style local_30 [8];
  Am_Style local_28 [8];
  int local_20;
  int local_1c;
  int y;
  int x;
  int y_counter;
  int x_counter;
  Am_Drawonable *d_local;
  
  _y_counter = d;
  Am_Style::Am_Style(local_28,(Am_Style *)&black);
  Am_Style::Am_Style(local_30,(Am_Style *)&red);
  Am_Style::Am_Style(local_48,(Am_Style *)&black);
  Am_Style::Am_Style(local_50,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_58,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_60,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_68,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
  arg7 = local_70;
  set_style_array(local_28,local_30,local_48,local_50,local_58,local_60,local_68,arg7);
  Am_Style::~Am_Style(local_70);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  Am_Style::~Am_Style(local_30);
  Am_Style::~Am_Style(local_28);
  for (x = 0; x < 2; x = x + 1) {
    for (y = 0; y < 2; y = y + 1) {
      local_1c = x * 0x4b + 10;
      local_20 = y * 0x4b + 10;
      arg7 = (Am_Style *)((ulong)arg7 & 0xffffffff00000000);
      (**(code **)(*(long *)_y_counter + 0x130))
                (_y_counter,&Am_No_Style,style_array + (long)(x + y) * 8,local_1c,local_20,0x32,0x32
                 ,arg7,0x168,0,1);
    }
  }
  return;
}

Assistant:

void
draw_4_circles(Am_Drawonable *d)
{
  int x_counter, y_counter, x, y;

  set_style_array(black, red, black);
  for (x_counter = 0; x_counter <= 1; x_counter++) {
    for (y_counter = 0; y_counter <= 1; y_counter++) {
      x = 10 + (75 * x_counter);
      y = 10 + (75 * y_counter);
      d->Draw_Arc(Am_No_Style, style_array[x_counter + y_counter], x, y, 50,
                  50);
    }
  }
}